

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::ConsumerIPCService::ObserveEvents
          (ConsumerIPCService *this,ObserveEventsRequest *req,DeferredObserveEventsResponse *resp)

{
  ConsumerEndpoint *pCVar1;
  ObservableEvents_Type *type;
  RemoteConsumer *this_00;
  pointer pOVar2;
  ObservableEvents_Type OVar3;
  
  this_00 = GetConsumerForCurrentRequest(this);
  RemoteConsumer::CloseObserveEventsResponseStream(this_00);
  ipc::DeferredBase::operator=
            (&(this_00->observe_events_response).super_DeferredBase,&resp->super_DeferredBase);
  OVar3 = ObservableEvents_Type_TYPE_UNSPECIFIED;
  for (pOVar2 = (req->events_to_observe_).
                super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pOVar2 != (req->events_to_observe_).
                super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
                ._M_impl.super__Vector_impl_data._M_finish; pOVar2 = pOVar2 + 1) {
    OVar3 = OVar3 | *pOVar2;
  }
  pCVar1 = (this_00->service_endpoint)._M_t.
           super___uniq_ptr_impl<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::ConsumerEndpoint_*,_std::default_delete<perfetto::ConsumerEndpoint>_>
           .super__Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false>._M_head_impl;
  (*pCVar1->_vptr_ConsumerEndpoint[0xc])(pCVar1,(ulong)OVar3);
  if (OVar3 != ObservableEvents_Type_TYPE_UNSPECIFIED) {
    return;
  }
  RemoteConsumer::CloseObserveEventsResponseStream(this_00);
  return;
}

Assistant:

void ConsumerIPCService::ObserveEvents(
    const protos::gen::ObserveEventsRequest& req,
    DeferredObserveEventsResponse resp) {
  RemoteConsumer* remote_consumer = GetConsumerForCurrentRequest();

  // If there's a prior stream, close it so that client can clean it up.
  remote_consumer->CloseObserveEventsResponseStream();

  remote_consumer->observe_events_response = std::move(resp);

  uint32_t events_mask = 0;
  for (const auto& type : req.events_to_observe()) {
    events_mask |= static_cast<uint32_t>(type);
  }
  remote_consumer->service_endpoint->ObserveEvents(events_mask);

  // If no events are to be observed, close the stream immediately so that the
  // client can clean up.
  if (events_mask == 0)
    remote_consumer->CloseObserveEventsResponseStream();
}